

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O3

void __thiscall dynamicgraph::Tracer::Tracer(Tracer *this,string *n)

{
  SignalTimeDependent<int,_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  size_type *psVar4;
  string doc;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  undefined1 local_100 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  SignalTimeDependent<int,_int> *local_a8;
  NameList *local_a0;
  string *local_98;
  string local_90;
  string local_70;
  undefined1 local_50 [32];
  
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)n);
  *(undefined ***)this = &PTR__Tracer_0011b1a8;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->toTraceSignals;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->toTraceSignals;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->files_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->files_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->files_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->files_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->files_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->traceStyle = EACH_TIME;
  this->frequency = 1.0;
  local_b0 = &(this->basename).field_2;
  (this->basename)._M_dataplus._M_p = (pointer)local_b0;
  (this->basename)._M_string_length = 0;
  (this->basename).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->suffix).field_2;
  (this->suffix)._M_dataplus._M_p = (pointer)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->suffix,".dat","");
  local_c0 = &(this->rootdir).field_2;
  (this->rootdir)._M_dataplus._M_p = (pointer)local_c0;
  (this->rootdir)._M_string_length = 0;
  (this->rootdir).field_2._M_local_buf[0] = '\0';
  this->namesSet = false;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->files;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->files;
  local_a0 = &this->names;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_a0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_a0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->play = false;
  this->timeStart = 0;
  local_50._8_8_ = recordTrigger;
  local_50._16_8_ = 0;
  local_50._0_8_ =
       boost::function2<int&,int&,int>::
       assign_to<boost::_bi::bind_t<int&,boost::_mfi::mf2<int&,dynamicgraph::Tracer,int&,int_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<1>,boost::arg<2>>>>(boost::_bi::bind_t<int&,boost::_mfi::mf2<int&,dynamicgraph::Tracer,int&,int_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<int>,boost::arg<int>>>)
       ::stored_vtable + 1;
  local_98 = &this->suffix;
  local_50._24_8_ = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 "Tracer(",n);
  plVar3 = (long *)std::__cxx11::string::append(local_100);
  this_00 = &this->triger;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  SignalTimeDependent<int,_int>::SignalTimeDependent
            (this_00,(function2<int_&,_int_&,_int> *)local_50,(SignalArray_const<int> *)&sotNOSIGNAL
             ,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  boost::function2<int_&,_int_&,_int>::~function2((function2<int_&,_int_&,_int> *)local_50);
  local_a8 = this_00;
  SignalArray<int>::SignalArray
            ((SignalArray<int> *)local_100,
             (SignalBase<int> *)
             ((long)&(this_00->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this_00->super_TimeDependency<int>)._vptr_TimeDependency[-3]));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  SignalArray<int>::~SignalArray((SignalArray<int> *)local_100);
  local_100._8_8_ = (pointer)0x0;
  local_100[0x10] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Add a new signal to trace.","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"string (signal name)","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"string (filename, empty for default","");
  command::docCommandVoid2(&local_160,&local_180,&local_120,&local_140);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  paVar1 = &local_160.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"add","");
  command::makeCommandVoid2<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)addSignalToTraceByName,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Remove all signals. If necessary, close open files.","");
  command::docCommandVoid0(&local_160,&local_180);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"clear","");
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)clearSignalToTrace,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "Gives the args for file opening, and if signals have been set, open the corresponding files."
             ,"");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"string (dirname)","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"string (prefix)","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"string (suffix)","");
  command::docCommandVoid3(&local_160,&local_180,&local_120,&local_140,&local_70);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"open","");
  command::
  makeCommandVoid3<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)openFiles,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Close all the open files.","");
  command::docCommandVoid0(&local_160,&local_180);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"close","");
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)0x49,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "If necessary, dump (can be done automatically for some traces type).","");
  command::docCommandVoid0(&local_160,&local_180);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"dump","");
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)0x61,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Start the tracing process.","");
  command::docCommandVoid0(&local_160,&local_180);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"start","");
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)start,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Stop temporarily the tracing process.","");
  command::docCommandVoid0(&local_160,&local_180);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"stop","");
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)stop,0,(string *)local_100);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"getTimeStart","");
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"timeStart","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"int","");
  command::docDirectGetter(&local_180,&local_120,&local_140);
  command::makeDirectGetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_180);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"setTimeStart","");
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"timeStart","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"int","");
  command::docDirectSetter(&local_180,&local_120,&local_140);
  command::makeDirectSetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_180);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  return;
}

Assistant:

Tracer::Tracer(const std::string n)
    : Entity(n),
      toTraceSignals(),
      traceStyle(TRACE_STYLE_DEFAULT),
      frequency(1),
      basename(),
      suffix(".dat"),
      rootdir(),
      namesSet(false),
      files(),
      names(),
      play(false),
      timeStart(0),
      triger(boost::bind(&Tracer::recordTrigger, this, _1, _2), sotNOSIGNAL,
             "Tracer(" + n + ")::triger") {
  signalRegistration(triger);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc;

    doc = docCommandVoid2("Add a new signal to trace.", "string (signal name)",
                          "string (filename, empty for default");
    addCommand("add",
               makeCommandVoid2(*this, &Tracer::addSignalToTraceByName, doc));

    doc =
        docCommandVoid0("Remove all signals. If necessary, close open files.");
    addCommand("clear",
               makeCommandVoid0(*this, &Tracer::clearSignalToTrace, doc));

    doc = docCommandVoid3(
        "Gives the args for file opening, and "
        "if signals have been set, open the corresponding files.",
        "string (dirname)", "string (prefix)", "string (suffix)");
    addCommand("open", makeCommandVoid3(*this, &Tracer::openFiles, doc));

    doc = docCommandVoid0("Close all the open files.");
    addCommand("close", makeCommandVoid0(*this, &Tracer::closeFiles, doc));

    doc = docCommandVoid0(
        "If necessary, dump "
        "(can be done automatically for some traces type).");
    addCommand("dump", makeCommandVoid0(*this, &Tracer::trace, doc));

    doc = docCommandVoid0("Start the tracing process.");
    addCommand("start", makeCommandVoid0(*this, &Tracer::start, doc));

    doc = docCommandVoid0("Stop temporarily the tracing process.");
    addCommand("stop", makeCommandVoid0(*this, &Tracer::stop, doc));

    addCommand("getTimeStart",
               makeDirectGetter(*this, &timeStart,
                                docDirectGetter("timeStart", "int")));
    addCommand("setTimeStart",
               makeDirectSetter(*this, &timeStart,
                                docDirectSetter("timeStart", "int")));
  }  // using namespace command
}